

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicBuiltinVariables::RunIteration
          (BasicBuiltinVariables *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *pCVar1;
  GLuint *buffers;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  GLuint GVar10;
  undefined4 extraout_EAX;
  int iVar11;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  ostream *poVar12;
  Vector<unsigned_int,_4> *pVVar13;
  uint uVar14;
  bool *compile_error;
  Vector<unsigned_int,_4> *pVVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uvec3 global_size;
  Vector<unsigned_int,_4> local_260;
  Vector<unsigned_int,_4> local_250;
  CallLogWrapper *local_240;
  ulong local_238;
  ulong local_230;
  string local_228;
  Vector<unsigned_int,_4> local_208;
  Vector<unsigned_int,_4> local_1f8;
  Vector<unsigned_int,_4> local_1e8;
  Vector<unsigned_int,_4> local_1d8;
  Vector<unsigned_int,_4> local_1c8;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  tcu::operator*((tcu *)&global_size,param_1,num_groups);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  poVar12 = std::operator<<((ostream *)
                            &data.
                             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            "\nlayout(local_size_x = ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", local_size_y = ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", local_size_z = ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,") in;\nconst uvec3 kGlobalSize = uvec3(");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,", ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,
                            ");\nlayout(std430) buffer OutputBuffer {\n  uvec4 num_work_groups[");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"];\n  uvec4 work_group_size[");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"];\n  uvec4 work_group_id[");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"];\n  uvec4 local_invocation_id[");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"];\n  uvec4 global_invocation_id[");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  poVar12 = std::operator<<(poVar12,"];\n  uvec4 local_invocation_index[");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::operator<<(poVar12,
                  "];\n} g_out_buffer;\nvoid main() {\n  if ((gl_WorkGroupSize * gl_WorkGroupID + gl_LocalInvocationID) != gl_GlobalInvocationID) return;\n  uint global_index = gl_GlobalInvocationID.x +\n                      gl_GlobalInvocationID.y * kGlobalSize.x +\n                      gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.num_work_groups[global_index] = uvec4(gl_NumWorkGroups, 0);\n  g_out_buffer.work_group_size[global_index] = uvec4(gl_WorkGroupSize, 0);\n  g_out_buffer.work_group_id[global_index] = uvec4(gl_WorkGroupID, 0);\n  g_out_buffer.local_invocation_id[global_index] = uvec4(gl_LocalInvocationID, 0);\n  g_out_buffer.global_invocation_id[global_index] = uvec4(gl_GlobalInvocationID, 0);\n  g_out_buffer.local_invocation_index[global_index] = uvec4(gl_LocalInvocationIndex);\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  GVar10 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_228);
  this->m_program = GVar10;
  std::__cxx11::string::~string((string *)&local_228);
  pCVar1 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(pCVar1,this->m_program);
  bVar9 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar9) {
    uVar14 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
             * param_1->m_data[2] * num_groups->m_data[2];
    uVar16 = (ulong)uVar14;
    local_238 = (ulong)(uVar14 * 6);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector(&data,local_238,(allocator_type *)&local_228);
    buffers = &this->m_storage_buffer;
    GVar10 = this->m_storage_buffer;
    if (GVar10 == 0) {
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,buffers);
      GVar10 = *buffers;
    }
    glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,0,GVar10);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x90d2,uVar16 * 0x60,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
    if (dispatch_indirect) {
      GVar10 = this->m_dispatch_buffer;
      if (GVar10 == 0) {
        glu::CallLogWrapper::glGenBuffers(pCVar1,1,&this->m_dispatch_buffer);
        GVar10 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(pCVar1,0x90ee,GVar10);
      glu::CallLogWrapper::glBufferData(pCVar1,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(pCVar1,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (pCVar1,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
    pVVar13 = (Vector<unsigned_int,_4> *)
              glu::CallLogWrapper::glMapBufferRange(pCVar1,0x90d2,0,uVar16 * 0x60,1);
    pVVar15 = pVVar13;
    local_240 = pCVar1;
    for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      tcu::Vector<unsigned_int,_4>::Vector(&local_1c8,pVVar15);
      uVar2 = *(undefined8 *)(num_groups->m_data + 1);
      auVar19._0_4_ = -(uint)(num_groups->m_data[0] == local_1c8.m_data[0]);
      auVar19._4_4_ = -(uint)((uint)uVar2 == local_1c8.m_data[1]);
      auVar19._8_4_ = -(uint)((uint)((ulong)uVar2 >> 0x20) == local_1c8.m_data[2]);
      auVar19._12_4_ = -(uint)(local_1c8.m_data[3] == 0);
      iVar11 = movmskps(extraout_EAX,auVar19);
      if (iVar11 != 0xf) {
        bVar9 = false;
        anon_unknown_0::Output
                  ("gl_NumWorkGroups: Invalid data at index %d.\n",uVar2,uVar18 & 0xffffffff);
        goto LAB_00c1fa32;
      }
      pVVar15 = pVVar15 + 1;
    }
    uVar18 = (ulong)(uVar14 * 2);
    pVVar15 = pVVar13 + uVar16;
    for (; uVar16 < uVar18; uVar16 = uVar16 + 1) {
      tcu::Vector<unsigned_int,_4>::Vector(&local_1d8,pVVar15);
      uVar2 = *(undefined8 *)(param_1->m_data + 1);
      auVar20._0_4_ = -(uint)(param_1->m_data[0] == local_1d8.m_data[0]);
      auVar20._4_4_ = -(uint)((uint)uVar2 == local_1d8.m_data[1]);
      auVar20._8_4_ = -(uint)((uint)((ulong)uVar2 >> 0x20) == local_1d8.m_data[2]);
      auVar20._12_4_ = -(uint)(local_1d8.m_data[3] == 0);
      iVar11 = movmskps(extraout_EAX_00,auVar20);
      if (iVar11 != 0xf) {
        bVar9 = false;
        anon_unknown_0::Output
                  ("gl_WorkGroupSize: Invalid data at index %d.\n",uVar2,uVar16 & 0xffffffff);
        goto LAB_00c1fa32;
      }
      pVVar15 = pVVar15 + 1;
    }
    uVar16 = (ulong)(uVar14 * 3);
    pVVar15 = pVVar13 + uVar18;
    uVar17 = 0;
    for (; uVar18 < uVar16; uVar18 = uVar18 + 1) {
      uVar3 = param_1->m_data[0];
      uVar4 = param_1->m_data[1];
      uVar6 = (ulong)(num_groups->m_data[0] * uVar3);
      uVar8 = uVar17 / uVar6;
      uVar7 = (ulong)(num_groups->m_data[1] * uVar4);
      uVar5 = param_1->m_data[2];
      tcu::Vector<unsigned_int,_4>::Vector(&local_1e8,pVVar15);
      auVar21._0_4_ = -(uint)((uint)(((ulong)uVar17 % uVar6) / (ulong)uVar3) == local_1e8.m_data[0])
      ;
      auVar21._4_4_ = -(uint)((uint)((uVar8 % uVar7) / (ulong)uVar4) == local_1e8.m_data[1]);
      auVar21._8_4_ = -(uint)((uint)((uVar8 / uVar7) / (ulong)uVar5) == local_1e8.m_data[2]);
      auVar21._12_4_ = -(uint)(local_1e8.m_data[3] == 0);
      iVar11 = movmskps(extraout_EAX_01,auVar21);
      if (iVar11 != 0xf) {
        bVar9 = false;
        anon_unknown_0::Output("gl_WorkGroupID: Invalid data at index %d.\n",uVar18 & 0xffffffff);
        goto LAB_00c1fa32;
      }
      uVar17 = uVar17 + 1;
      pVVar15 = pVVar15 + 1;
    }
    local_230 = (ulong)(uVar14 * 4);
    pVVar15 = pVVar13 + uVar16;
    uVar17 = 0;
    for (; uVar16 < local_230; uVar16 = uVar16 + 1) {
      uVar3 = param_1->m_data[0];
      uVar4 = param_1->m_data[1];
      uVar18 = (ulong)(num_groups->m_data[0] * uVar3);
      uVar7 = uVar17 / uVar18;
      uVar6 = (ulong)(num_groups->m_data[1] * uVar4);
      uVar5 = param_1->m_data[2];
      tcu::Vector<unsigned_int,_4>::Vector(&local_1f8,pVVar15);
      auVar22._0_4_ =
           -(uint)((uint)(((ulong)uVar17 % uVar18) % (ulong)uVar3) == local_1f8.m_data[0]);
      auVar22._4_4_ = -(uint)((uint)((uVar7 % uVar6) % (ulong)uVar4) == local_1f8.m_data[1]);
      auVar22._8_4_ = -(uint)((uint)((uVar7 / uVar6) % (ulong)uVar5) == local_1f8.m_data[2]);
      auVar22._12_4_ = -(uint)(local_1f8.m_data[3] == 0);
      iVar11 = movmskps(extraout_EAX_02,auVar22);
      if (iVar11 != 0xf) {
        bVar9 = false;
        anon_unknown_0::Output
                  ("gl_LocalInvocationID: Invalid data at index %d.\n",uVar16 & 0xffffffff);
        goto LAB_00c1fa32;
      }
      uVar17 = uVar17 + 1;
      pVVar15 = pVVar15 + 1;
    }
    uVar18 = (ulong)(uVar14 * 5);
    pVVar15 = pVVar13 + local_230;
    uVar14 = 0;
    for (uVar16 = local_230; uVar16 < uVar18; uVar16 = uVar16 + 1) {
      uVar17 = num_groups->m_data[0] * param_1->m_data[0];
      uVar7 = (ulong)uVar14 / (ulong)uVar17;
      uVar6 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
      tcu::Vector<unsigned_int,_4>::Vector(&local_208,pVVar15);
      auVar23._0_4_ = -(uint)(uVar14 % uVar17 == local_208.m_data[0]);
      auVar23._4_4_ = -(uint)((uint)(uVar7 % uVar6) == local_208.m_data[1]);
      auVar23._8_4_ = -(uint)((uint)(uVar7 / uVar6) == local_208.m_data[2]);
      auVar23._12_4_ = -(uint)(local_208.m_data[3] == 0);
      iVar11 = movmskps(extraout_EAX_03,auVar23);
      if (iVar11 != 0xf) {
        bVar9 = false;
        anon_unknown_0::Output
                  ("gl_GlobalInvocationID: Invalid data at index %d.\n",uVar16 & 0xffffffff);
        goto LAB_00c1fa32;
      }
      uVar14 = uVar14 + 1;
      pVVar15 = pVVar15 + 1;
    }
    pVVar13 = pVVar13 + uVar18;
    uVar14 = 0;
    for (; pCVar1 = local_240, uVar18 < local_238; uVar18 = uVar18 + 1) {
      uVar17 = param_1->m_data[0];
      uVar3 = param_1->m_data[1];
      uVar16 = (ulong)(num_groups->m_data[0] * uVar17);
      uVar7 = uVar14 / uVar16;
      uVar6 = (ulong)(num_groups->m_data[1] * uVar3);
      uVar4 = param_1->m_data[2];
      tcu::Vector<unsigned_int,_4>::Vector(&local_250,pVVar13);
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_260,
                 (uVar3 * (int)((uVar7 / uVar6) % (ulong)uVar4) +
                 (int)((uVar7 % uVar6) % (ulong)uVar3)) * uVar17 +
                 (int)(((ulong)uVar14 % uVar16) % (ulong)uVar17));
      if ((((local_250.m_data[0] != local_260.m_data[0]) ||
           (local_250.m_data[1] != local_260.m_data[1])) ||
          (local_250.m_data[2] != local_260.m_data[2])) ||
         (local_250.m_data[3] != local_260.m_data[3])) {
        bVar9 = false;
        anon_unknown_0::Output
                  ("gl_LocalInvocationIndex: Invalid data at index %d.\n",uVar18 & 0xffffffff);
        goto LAB_00c1fa32;
      }
      uVar14 = uVar14 + 1;
      pVVar13 = pVVar13 + 1;
    }
    glu::CallLogWrapper::glUnmapBuffer(local_240,0x90d2);
    bVar9 = true;
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
LAB_00c1fa32:
    std::_Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
    ::~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   );
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		std::vector<uvec4> data(kBufferSize * 6);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kBufferSize * 6, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		uvec4* result;
		result = static_cast<uvec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(uvec4) * kBufferSize * 6, GL_MAP_READ_BIT));

		// gl_NumWorkGroups
		for (GLuint index = 0; index < kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(num_groups.x(), num_groups.y(), num_groups.z(), 0)))
			{
				Output("gl_NumWorkGroups: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupSize
		for (GLuint index = kBufferSize; index < 2 * kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(local_size.x(), local_size.y(), local_size.z(), 0)))
			{
				Output("gl_WorkGroupSize: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupID
		for (GLuint index = 2 * kBufferSize; index < 3 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 2 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() /= local_size.x();
			expected.y() /= local_size.y();
			expected.z() /= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_WorkGroupID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationID
		for (GLuint index = 3 * kBufferSize; index < 4 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 3 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() %= local_size.x();
			expected.y() %= local_size.y();
			expected.z() %= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_LocalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_GlobalInvocationID
		for (GLuint index = 4 * kBufferSize; index < 5 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 4 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_GlobalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationIndex
		for (GLuint index = 5 * kBufferSize; index < 6 * kBufferSize; ++index)
		{
			uvec3 coord = IndexTo3DCoord(index - 5 * kBufferSize, local_size.x() * num_groups.x(),
										 local_size.y() * num_groups.y());
			const GLuint expected = (coord.x() % local_size.x()) + (coord.y() % local_size.y()) * local_size.x() +
									(coord.z() % local_size.z()) * local_size.x() * local_size.y();
			if (!IsEqual(result[index], uvec4(expected)))
			{
				Output("gl_LocalInvocationIndex: Invalid data at index %d.\n", index);
				return false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return true;
	}